

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqdebug.cpp
# Opt level: O0

void __thiscall SQVM::Raise_Error(SQVM *this,SQObjectPtr *desc)

{
  SQObjectPtr *in_RDI;
  SQObjectPtr *unaff_retaddr;
  
  ::SQObjectPtr::operator=(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void SQVM::Raise_Error(const SQObjectPtr &desc)
{
    _lasterror = desc;
}